

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  Mutex *this_00;
  Tables *this_01;
  long lVar1;
  second_type value;
  DescriptorPool *pDVar2;
  string *psVar3;
  long *plVar4;
  EnumValueOptions *pEVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string enum_value_name;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  value = FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                    ((hash_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                      *)(this->enum_values_by_number_).
                        super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                        ._M_h._M_buckets,
                     (first_type *)
                     (this->enum_values_by_number_).
                     super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                     ._M_h._M_bucket_count);
  if (value == (second_type)0x0) {
    this_00 = &this->unknown_enum_values_mu_;
    internal::Mutex::Lock(this_00);
    value = FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                      ((hash_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                        *)(this->unknown_enum_values_by_number_).
                          super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                          ._M_h._M_buckets,
                       (first_type *)
                       (this->unknown_enum_values_by_number_).
                       super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                       ._M_h._M_bucket_count);
    internal::Mutex::Unlock(this_00);
    if (value == (second_type)0x0) {
      internal::Mutex::Lock(this_00);
      value = FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                        ((hash_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                          *)(this->unknown_enum_values_by_number_).
                            super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                            ._M_h._M_buckets,
                         (first_type *)
                         (this->unknown_enum_values_by_number_).
                         super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                         ._M_h._M_bucket_count);
      if (value == (second_type)0x0) {
        StringPrintf_abi_cxx11_
                  (&local_50,"UNKNOWN_ENUM_VALUE_%s_%d",**(undefined8 **)parent,(ulong)(uint)number)
        ;
        pDVar2 = DescriptorPool::generated_pool();
        this_01 = (pDVar2->tables_).ptr_;
        value = (second_type)DescriptorPool::Tables::AllocateBytes(this_01,0x28);
        psVar3 = DescriptorPool::Tables::AllocateString(this_01,&local_50);
        *(string **)value = psVar3;
        local_90[0] = local_80;
        lVar1 = **(long **)(parent + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,lVar1,(*(long **)(parent + 8))[1] + lVar1);
        std::__cxx11::string::append((char *)local_90);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_90,(ulong)local_50._M_dataplus._M_p);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_70.field_2._M_allocated_capacity = *psVar6;
          local_70.field_2._8_8_ = plVar4[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar6;
          local_70._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_70._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        psVar3 = DescriptorPool::Tables::AllocateString(this_01,&local_70);
        *(string **)(value + 8) = psVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        *(int *)(value + 0x10) = number;
        *(EnumDescriptor **)(value + 0x18) = parent;
        pEVar5 = EnumValueOptions::default_instance();
        *(EnumValueOptions **)(value + 0x20) = pEVar5;
        local_70._M_string_length = CONCAT44(local_70._M_string_length._4_4_,number);
        local_70._M_dataplus._M_p = (pointer)parent;
        InsertIfNotPresent<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                  (&this->unknown_enum_values_by_number_,(first_type *)&local_70,
                   (second_type *)value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      internal::Mutex::Unlock(this_00);
    }
  }
  return value;
}

Assistant:

inline const EnumValueDescriptor*
FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown(
    const EnumDescriptor* parent, int number) const {
  // First try, with map of compiled-in values.
  {
    const EnumValueDescriptor* desc =
        FindPtrOrNull(enum_values_by_number_, std::make_pair(parent, number));
    if (desc != NULL) {
      return desc;
    }
  }
  // Second try, with reader lock held on unknown enum values: common case.
  {
    ReaderMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != NULL) {
      return desc;
    }
  }
  // If not found, try again with writer lock held, and create new descriptor if
  // necessary.
  {
    WriterMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != NULL) {
      return desc;
    }

    // Create an EnumValueDescriptor dynamically. We don't insert it into the
    // EnumDescriptor (it's not a part of the enum as originally defined), but
    // we do insert it into the table so that we can return the same pointer
    // later.
    string enum_value_name = StringPrintf(
        "UNKNOWN_ENUM_VALUE_%s_%d", parent->name().c_str(), number);
    DescriptorPool::Tables* tables =
        const_cast<DescriptorPool::Tables*>(DescriptorPool::generated_pool()->
                                            tables_.get());
    EnumValueDescriptor* result = tables->Allocate<EnumValueDescriptor>();
    result->name_ = tables->AllocateString(enum_value_name);
    result->full_name_ = tables->AllocateString(parent->full_name() +
                                                "." + enum_value_name);
    result->number_ = number;
    result->type_ = parent;
    result->options_ = &EnumValueOptions::default_instance();
    InsertIfNotPresent(&unknown_enum_values_by_number_,
                       std::make_pair(parent, number), result);
    return result;
  }
}